

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

bool bloaty::anon_unknown_0::ReadElfArchMode(InputFile *file,cs_arch *arch,cs_mode *mode)

{
  bool capstone_available;
  RangeSink *in_stack_000003d8;
  InputFile *in_stack_000003e0;
  anon_class_24_3_9b406a91 in_stack_000003f0;
  
  (anonymous_namespace)::
  ForEachElf<bloaty::(anonymous_namespace)::ReadElfArchMode(bloaty::InputFile_const&,cs_arch*,cs_mode*)::__0>
            (in_stack_000003e0,in_stack_000003d8,in_stack_000003f0);
  return true;
}

Assistant:

static bool ReadElfArchMode(const InputFile& file, cs_arch* arch, cs_mode* mode) {
  bool capstone_available = true;
  ForEachElf(file, nullptr,
             [&capstone_available, arch, mode](const ElfFile& elf,
                                               string_view /*filename*/,
                                               uint32_t /*index_base*/) {
               // Last .o file wins?  (For .a files)?  It's kind of arbitrary,
               // but a single .a file shouldn't have multiple archs in it.
               capstone_available &=
                   ElfMachineToCapstone(elf.header().e_machine, arch, mode);
             });
  return capstone_available;
}